

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void cppcms::json::anon_unknown_9::indent(ostream *out,char c,int *tabs)

{
  int iVar1;
  ostream *poVar2;
  int *in_RDX;
  char in_SIL;
  ostream *in_RDI;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (*in_RDX < 0) {
    std::operator<<(in_RDI,in_SIL);
    return;
  }
  iVar1 = (int)in_SIL;
  if (iVar1 == 0x2c) {
    poVar2 = std::operator<<(in_RDI,in_SIL);
    std::operator<<(poVar2,'\n');
    pad((ostream *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    return;
  }
  if (iVar1 == 0x3a) {
    std::operator<<(in_RDI," :\t");
    return;
  }
  if (iVar1 == 0x5b) {
LAB_003e316d:
    poVar2 = std::operator<<(in_RDI,in_SIL);
    std::operator<<(poVar2,'\n');
    *in_RDX = *in_RDX + 1;
    pad((ostream *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  else {
    if (iVar1 != 0x5d) {
      if (iVar1 == 0x7b) goto LAB_003e316d;
      if (iVar1 != 0x7d) {
        return;
      }
    }
    std::operator<<(in_RDI,'\n');
    *in_RDX = *in_RDX + -1;
    pad((ostream *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    poVar2 = std::operator<<(in_RDI,in_SIL);
    std::operator<<(poVar2,'\n');
    pad((ostream *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void indent(std::ostream &out,char c,int &tabs)
		{
			if(tabs < 0) {
				out<<c;
				return;
			}
			switch(c) {
			case '{':
			case '[':
				out<<c<<'\n';
				tabs++;
				pad(out,tabs);
				break;
			case ',':
				out<<c<<'\n';
				pad(out,tabs);
				break;
			case ':':
				out<<" :\t";
				break;
			case '}':
			case ']':
				out<<'\n';
				tabs--;
				pad(out,tabs);
				out<<c<<'\n';
				pad(out,tabs);
				break;
			}
		}